

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void phmap::container_internal::
     map_slot_policy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
     ::
     transfer<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
               (allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  *alloc_local;
  
  map_slot_policy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  ::emplace(new_slot);
  allocator_traits<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
  ::
  construct<std::pair<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,std::pair<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>
            (alloc,(pair<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
                    *)&new_slot->value,
             (pair<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
              *)&old_slot->value);
  destroy<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
            (alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }